

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

Vec_Int_t * Mop_ManFindDist1Pairs(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  long lVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  word *pwVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *p_00;
  int *piVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  long local_58;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar10 = (int *)malloc(400);
  p_00->pArray = piVar10;
  if (0 < vGroup->nSize) {
    local_58 = 1;
    lVar11 = 0;
    do {
      iVar2 = vGroup->pArray[lVar11];
      uVar8 = p->nWordsIn * iVar2;
      if (((int)uVar8 < 0) || (p->vWordsIn->nSize <= (int)uVar8)) {
LAB_00333a5f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      lVar1 = lVar11 + 1;
      if (lVar1 < vGroup->nSize) {
        pwVar4 = p->vWordsIn->pArray;
        lVar17 = local_58;
        do {
          uVar12 = p->nWordsIn;
          uVar13 = uVar12 * vGroup->pArray[lVar17];
          if (((int)uVar13 < 0) || (p->vWordsIn->nSize <= (int)uVar13)) goto LAB_00333a5f;
          if (0 < (int)uVar12) {
            uVar14 = 0;
            bVar18 = false;
            do {
              uVar16 = pwVar4[uVar8 + uVar14];
              uVar15 = p->vWordsIn->pArray[uVar13 + uVar14];
              bVar6 = false;
              if (uVar16 != uVar15) {
                uVar15 = uVar15 ^ uVar16;
                bVar6 = true;
                if (((((uVar15 >> 1 ^ uVar15) & 0x5555555555555555) == 0) &&
                    (uVar16 = uVar15 & 0x5555555555555555 & uVar15 >> 1, uVar16 != 0)) &&
                   (bVar7 = !bVar18, bVar18 = true, bVar7)) {
                  uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
                  bVar18 = ((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                           < 2;
                  bVar6 = !bVar18;
                }
              }
              if (bVar6) {
                bVar18 = false;
                break;
              }
              uVar14 = uVar14 + 1;
            } while (uVar12 != uVar14);
            if (bVar18) {
              iVar9 = p->nWordsOut;
              uVar12 = iVar9 * iVar2;
              if ((int)uVar12 < 0) goto LAB_00333a5f;
              iVar3 = p->vWordsOut->nSize;
              if (((iVar3 <= (int)uVar12) ||
                  (uVar13 = vGroup->pArray[lVar17] * iVar9, (int)uVar13 < 0)) ||
                 (iVar3 <= (int)uVar13)) goto LAB_00333a5f;
              pwVar5 = p->vWordsOut->pArray;
              iVar9 = bcmp(pwVar5 + uVar12,pwVar5 + uVar13,(long)iVar9 << 3);
              if (iVar9 == 0) {
                Vec_IntPush(p_00,(int)lVar11);
                Vec_IntPush(p_00,(int)lVar17);
              }
            }
          }
          lVar17 = lVar17 + 1;
        } while ((int)lVar17 < vGroup->nSize);
      }
      local_58 = local_58 + 1;
      lVar11 = lVar1;
    } while (lVar1 < vGroup->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManFindDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int c1, c2, iCube1, iCube2;
    Vec_Int_t * vPairs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            if ( !memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) )
                Vec_IntPushTwo( vPairs, c1, c2 );
        }
    }
    return vPairs;
}